

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::Abort(DeathTestImpl *this,AbortReason reason)

{
  bool bVar1;
  int *piVar2;
  int in_ESI;
  DeathTestImpl *in_RDI;
  int gtest_retval;
  char status_ch;
  void *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  char *__rhs;
  undefined4 in_stack_fffffffffffffeb8;
  undefined1 uVar3;
  undefined1 in_stack_fffffffffffffebd;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 uVar4;
  int *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  char local_f9 [229];
  int local_14;
  undefined1 local_d;
  
  if (in_ESI == 2) {
    local_d = 0x4c;
    uVar4 = local_d;
  }
  else {
    in_stack_fffffffffffffebd = 0x52;
    in_stack_fffffffffffffebe = 0x54;
    uVar4 = in_stack_fffffffffffffebe;
    local_d = in_stack_fffffffffffffebe;
    if (in_ESI != 1) {
      in_stack_fffffffffffffebe = 0x52;
      uVar4 = in_stack_fffffffffffffebe;
      local_d = in_stack_fffffffffffffebe;
    }
  }
  while( true ) {
    do {
      write_fd(in_RDI);
      local_14 = posix::Write((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                              in_stack_fffffffffffffea8,0);
      uVar3 = false;
      if (local_14 == -1) {
        piVar2 = __errno_location();
        uVar3 = *piVar2 == 4;
      }
    } while ((bool)uVar3 != false);
    if (local_14 == -1) break;
    bVar1 = AlwaysFalse();
    if (!bVar1) {
      _exit(1);
    }
  }
  __rhs = local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
             (allocator<char> *)in_stack_fffffffffffffee0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffebe,
                                         CONCAT15(in_stack_fffffffffffffebd,
                                                  CONCAT14(uVar3,in_stack_fffffffffffffeb8)))),__rhs
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffebe,
                                         CONCAT15(in_stack_fffffffffffffebd,
                                                  CONCAT14(uVar3,in_stack_fffffffffffffeb8)))),__rhs
                );
  StreamableToString<int>(in_stack_fffffffffffffed8);
  std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffebe,
                                         CONCAT15(in_stack_fffffffffffffebd,
                                                  CONCAT14(uVar3,in_stack_fffffffffffffeb8)))),__rhs
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffebe,
                                         CONCAT15(in_stack_fffffffffffffebd,
                                                  CONCAT14(uVar3,in_stack_fffffffffffffeb8)))),__rhs
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffebe,
                                         CONCAT15(in_stack_fffffffffffffebd,
                                                  CONCAT14(uVar3,in_stack_fffffffffffffeb8)))),__rhs
                );
  DeathTestAbort((string *)in_RDI);
}

Assistant:

void DeathTestImpl::Abort(AbortReason reason) {
  // The parent process considers the death test to be a failure if
  // it finds any data in our pipe.  So, here we write a single flag byte
  // to the pipe, then exit.
  const char status_ch = reason == TEST_DID_NOT_DIE       ? kDeathTestLived
                         : reason == TEST_THREW_EXCEPTION ? kDeathTestThrew
                                                          : kDeathTestReturned;

  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Write(write_fd(), &status_ch, 1));
  // We are leaking the descriptor here because on some platforms (i.e.,
  // when built as Windows DLL), destructors of global objects will still
  // run after calling _exit(). On such systems, write_fd_ will be
  // indirectly closed from the destructor of UnitTestImpl, causing double
  // close if it is also closed here. On debug configurations, double close
  // may assert. As there are no in-process buffers to flush here, we are
  // relying on the OS to close the descriptor after the process terminates
  // when the destructors are not run.
  _exit(1);  // Exits w/o any normal exit hooks (we were supposed to crash)
}